

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
ColColDAGNode::ColColDAGNode(ColColDAGNode *this,int op,DAGNode *left,DAGNode *right)

{
  DAGNode *right_local;
  DAGNode *left_local;
  int op_local;
  ColColDAGNode *this_local;
  
  DAGNode::DAGNode(&this->super_DAGNode);
  (this->super_DAGNode)._vptr_DAGNode = (_func_int **)&PTR__ColColDAGNode_0010dca0;
  this->op_ = op;
  this->right_ = right;
  std::__cxx11::string::string((string *)&this->right_col_name_);
  this->left_ = left;
  std::__cxx11::string::string((string *)&this->left_col_name_);
  this->left_vec_ = (DbVector *)0x0;
  this->right_vec_ = (DbVector *)0x0;
  assignPrimitive_(this);
  return;
}

Assistant:

ColColDAGNode(int op, DAGNode* left, DAGNode* right) :
        op_(op), right_(right), left_(left), left_vec_(nullptr), right_vec_(nullptr) {
        assignPrimitive_();
    }